

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::
Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,
          OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>
          *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
  OVar3;
  Maybe<kj::Array<char>_> *pMVar4;
  NullableValue<char> _subResult425;
  ParserInput subInput;
  Results results;
  OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
  local_8c;
  char local_8b;
  OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
  local_8a;
  char local_89;
  IteratorInput<char,_const_char_*> local_88;
  char *local_68;
  Maybe<kj::Array<char>_> *local_60;
  ArrayBuilder<char> local_58;
  
  local_58.ptr = (char *)0x0;
  local_58.pos = (RemoveConst<char> *)0x0;
  local_58.endPtr = (char *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_60 = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) break;
    local_68 = input->begin;
    local_88.parent = &input->super_IteratorInput<char,_const_char_*>;
    local_88.pos = (char *)pAVar1;
    local_88.end = (char *)pAVar2;
    local_88.best = (char *)pAVar1;
    OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
    ::operator()(&local_8c,(ParserInput *)subParser);
    OVar3 = local_8c;
    local_8a = local_8c;
    if (local_8c ==
        (OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
         )0x1) {
      local_89 = local_8b;
      ((IteratorInput<char,_const_char_*> *)&(local_88.parent)->parent)->pos = local_88.pos;
      Vector<char>::add<char>((Vector<char> *)&local_58,&local_89);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_88);
  } while (OVar3 != (OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
                     )0x0);
  Vector<char>::releaseAsArray((Array<char> *)&local_88,(Vector<char> *)&local_58);
  pMVar4 = local_60;
  (local_60->ptr).isSet = true;
  (local_60->ptr).field_1.value.ptr = (char *)local_88.parent;
  (local_60->ptr).field_1.value.size_ = (size_t)local_88.pos;
  (local_60->ptr).field_1.value.disposer = (ArrayDisposer *)local_88.end;
  local_88.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_88.pos = (char *)0x0;
  Array<char>::~Array((Array<char> *)&local_88);
  ArrayBuilder<char>::dispose(&local_58);
  return pMVar4;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }